

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

void __thiscall
gl4cts::EnhancedLayouts::XFBVariableStrideTest::testInit(XFBVariableStrideTest *this)

{
  vector<gl4cts::EnhancedLayouts::XFBVariableStrideTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBVariableStrideTest::testCase>_>
  *this_00;
  GLuint i;
  GLuint index;
  GLuint stage;
  STAGES SVar1;
  Type TVar2;
  value_type local_44;
  
  this_00 = &this->m_test_cases;
  for (index = 0; index != 0x22; index = index + 1) {
    TVar2 = TestBase::getType((TestBase *)this,index);
    for (SVar1 = COMPUTE; SVar1 != STAGE_MAX; SVar1 = SVar1 + VERTEX) {
      if (SVar1 != FRAGMENT && (SVar1 & FRAGMENT) != COMPUTE) {
        local_44.m_case = VALID;
        this = (XFBVariableStrideTest *)this_00;
        local_44.m_stage = SVar1;
        local_44.m_type = TVar2;
        std::
        vector<gl4cts::EnhancedLayouts::XFBVariableStrideTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBVariableStrideTest::testCase>_>
        ::push_back(this_00,&local_44);
      }
    }
  }
  return;
}

Assistant:

void XFBVariableStrideTest::testInit()
{
	const GLuint n_types = getTypesNumber();

	for (GLuint i = 0; i < n_types; ++i)
	{
		const Utils::Type& type = getType(i);

		/*
		 Some of the cases are declared as following are considered as invalid,
		 but accoring to spec, the following declaration is valid: shaders in the
		 transform feedback capturing mode have an initial global default of layout(xfb_buffer=0) out,
		 so for the first variable's declaration, the xfb_stride = 16 is applied on buffer 0,  for the
		 second variable, its buffer is also inherited from global buffer 0, and its offset does not overflows
		 the stride.

		 The xfb_stride is the memory width of given buffer, not for variable even though xfb_stride
		 is declared on the variable. It seems that the writter of this case misunderstand the concept of
		 xfb_stride, because spec describes that xfb_stride can be declared multiple times for the same buffer,
		 it is a compile or link-time error to have different values specified for the stride for the same buffer.

		 int type_size = 8;
		 layout (xfb_offset = 0, xfb_stride = 2 * type_size) out double goku;
		 layout (xfb_offset = type_size)                     out double vegeta;
		 */
		// all the shaders are valid, so remove the following loop(it contains CASE_MAX is enum of valid and invalid)
		// for (GLuint c = 0; c < CASE_MAX; ++c)
		{
			for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
			{
				if ((Utils::Shader::COMPUTE == stage) || (Utils::Shader::TESS_CTRL == stage) ||
					(Utils::Shader::FRAGMENT == stage))
				{
					continue;
				}

				testCase test_case = { (CASES)VALID, (Utils::Shader::STAGES)stage, type };

				m_test_cases.push_back(test_case);
			}
		}
	}
}